

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

AssertionExpr * slang::ast::bindUnknownPortConn(ASTContext *context,PropertyExprSyntax *syntax)

{
  bool bVar1;
  int iVar2;
  Type *args;
  SimpleAssertionExpr *pSVar3;
  undefined4 extraout_var;
  SyntaxNode *in_RSI;
  SyntaxNode *in_RDI;
  LookupResult *in_stack_00000040;
  ASTContext *in_stack_00000048;
  NameSyntax *in_stack_00000050;
  bitmask<slang::ast::LookupFlags> in_stack_0000005c;
  ArbitrarySymbolExpression *hre;
  HierarchicalReference hierRef;
  Symbol *symbol;
  LookupResult result;
  ExpressionSyntax *expr;
  Compilation *comp;
  SimpleSequenceExprSyntax *simpSeq;
  SyntaxNode *node;
  bitmask<slang::ast::ASTFlags> flags;
  LookupResult *in_stack_fffffffffffffc70;
  ASTContext *in_stack_fffffffffffffc78;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffc80;
  SourceRange *in_stack_fffffffffffffc88;
  Symbol *args_1;
  LookupResult *in_stack_fffffffffffffca8;
  Compilation *in_stack_fffffffffffffcb0;
  ArbitrarySymbolExpression *in_stack_fffffffffffffcb8;
  SyntaxNode *in_stack_fffffffffffffcc0;
  sockaddr local_328 [3];
  underlying_type local_2f0;
  int local_2e4;
  SourceRange local_2e0;
  undefined1 *local_2d0;
  ArbitrarySymbolExpression *local_2c8;
  undefined1 local_2c0 [40];
  Symbol *local_298;
  bitmask<slang::ast::LookupFlags> local_290 [4];
  Symbol *local_280;
  SyntaxNode *local_40;
  Compilation *local_38;
  SimpleSequenceExprSyntax *local_30;
  SyntaxNode *local_28;
  underlying_type local_20;
  SyntaxNode *local_18;
  SyntaxNode *local_10;
  SimpleAssertionExpr *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = (underlying_type)
             operator|((ASTFlags)in_stack_fffffffffffffc78,(ASTFlags)in_stack_fffffffffffffc70);
  local_28 = local_18;
  if (local_18->kind == SimplePropertyExpr) {
    slang::syntax::SyntaxNode::as<slang::syntax::SimplePropertyExprSyntax>(local_18);
    local_28 = &not_null::operator_cast_to_SequenceExprSyntax_
                          ((not_null<slang::syntax::SequenceExprSyntax_*> *)0x36068b)->
                super_SyntaxNode;
    if ((local_28->kind == SimpleSequenceExpr) &&
       (local_30 = slang::syntax::SyntaxNode::as<slang::syntax::SimpleSequenceExprSyntax>(local_28),
       local_30->repetition == (SequenceRepetitionSyntax *)0x0)) {
      local_38 = ASTContext::getCompilation((ASTContext *)0x3606dc);
      local_40 = &not_null::operator_cast_to_ExpressionSyntax_
                            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x3606f5)->
                  super_SyntaxNode;
      while (local_40->kind == ParenthesizedExpression) {
        slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedExpressionSyntax>(local_40);
        local_40 = &not_null::operator_cast_to_ExpressionSyntax_
                              ((not_null<slang::syntax::ExpressionSyntax_*> *)0x360726)->
                    super_SyntaxNode;
      }
      bVar1 = slang::syntax::NameSyntax::isKind(local_40->kind);
      if (bVar1) {
        LookupResult::LookupResult(in_stack_fffffffffffffc70);
        slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>(local_40);
        in_stack_fffffffffffffcc0 = local_10;
        bitmask<slang::ast::LookupFlags>::bitmask(local_290,None);
        Lookup::name(in_stack_00000050,in_stack_00000048,in_stack_0000005c,in_stack_00000040);
        if ((local_280 == (Symbol *)0x0) ||
           ((((local_298 = local_280, local_280->kind != Modport &&
              (local_280->kind != InterfacePort)) && (local_280->kind != Instance)) &&
            ((local_280->kind != InstanceArray && (local_280->kind != UninstantiatedDef)))))) {
          local_2e4 = 0;
        }
        else {
          HierarchicalReference::fromLookup(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
          in_stack_fffffffffffffcb0 = local_38;
          in_stack_fffffffffffffcb8 =
               (ArbitrarySymbolExpression *)
               not_null<const_slang::ast::Scope_*>::operator*
                         ((not_null<const_slang::ast::Scope_*> *)0x360842);
          args_1 = local_298;
          args = Compilation::getVoidType(local_38);
          local_2d0 = local_2c0;
          local_2e0 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffcc0);
          local_2c8 = BumpAllocator::
                      emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::ast::HierarchicalReference*,slang::SourceRange>
                                (&in_stack_fffffffffffffcb0->super_BumpAllocator,(Scope *)args,
                                 args_1,(Type *)local_2e0.startLoc,
                                 (HierarchicalReference **)local_2e0.endLoc,
                                 in_stack_fffffffffffffc88);
          local_8 = BumpAllocator::
                    emplace<slang::ast::SimpleAssertionExpr,slang::ast::ArbitrarySymbolExpression&,std::nullopt_t_const&>
                              ((BumpAllocator *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                               (nullopt_t *)in_stack_fffffffffffffcb0);
          local_2e4 = 1;
        }
        LookupResult::~LookupResult(in_stack_fffffffffffffc70);
        if (local_2e4 != 0) {
          return &local_8->super_AssertionExpr;
        }
      }
      local_2f0 = local_20;
      Expression::bind((int)local_40,(sockaddr *)local_10,(socklen_t)local_20);
      pSVar3 = BumpAllocator::
               emplace<slang::ast::SimpleAssertionExpr,slang::ast::Expression_const&,std::nullopt_t_const&>
                         ((BumpAllocator *)in_stack_fffffffffffffcc0,
                          &in_stack_fffffffffffffcb8->super_Expression,
                          (nullopt_t *)in_stack_fffffffffffffcb0);
      return &pSVar3->super_AssertionExpr;
    }
  }
  slang::operator|((ASTFlags)in_stack_fffffffffffffc78,(bitmask<slang::ast::ASTFlags> *)local_18);
  iVar2 = (int)local_18;
  ASTContext::resetFlags(in_stack_fffffffffffffc78,in_stack_fffffffffffffc80);
  iVar2 = AssertionExpr::bind(iVar2,local_328,0);
  return (AssertionExpr *)CONCAT44(extraout_var,iVar2);
}

Assistant:

static const AssertionExpr* bindUnknownPortConn(const ASTContext& context,
                                                const PropertyExprSyntax& syntax) {
    // We have to check for a simple reference to an interface instance or port here,
    // since we don't know whether this is an interface port connection or even
    // a normal connection with a virtual interface type.
    const auto flags = ASTFlags::AllowUnboundedLiteral | ASTFlags::StreamingAllowed;
    const SyntaxNode* node = &syntax;
    if (node->kind == SyntaxKind::SimplePropertyExpr) {
        node = node->as<SimplePropertyExprSyntax>().expr;
        if (node->kind == SyntaxKind::SimpleSequenceExpr) {
            auto& simpSeq = node->as<SimpleSequenceExprSyntax>();
            if (!simpSeq.repetition) {
                auto& comp = context.getCompilation();
                const ExpressionSyntax* expr = simpSeq.expr;
                while (expr->kind == SyntaxKind::ParenthesizedExpression)
                    expr = expr->as<ParenthesizedExpressionSyntax>().expression;

                if (NameSyntax::isKind(expr->kind)) {
                    LookupResult result;
                    Lookup::name(expr->as<NameSyntax>(), context, LookupFlags::None, result);
                    if (result.found) {
                        auto symbol = result.found;
                        if (symbol->kind == SymbolKind::Modport ||
                            symbol->kind == SymbolKind::InterfacePort ||
                            symbol->kind == SymbolKind::Instance ||
                            symbol->kind == SymbolKind::InstanceArray ||
                            symbol->kind == SymbolKind::UninstantiatedDef) {

                            auto hierRef = HierarchicalReference::fromLookup(comp, result);
                            auto hre = comp.emplace<ArbitrarySymbolExpression>(
                                *context.scope, *symbol, comp.getVoidType(), &hierRef,
                                syntax.sourceRange());

                            return comp.emplace<SimpleAssertionExpr>(*hre, std::nullopt);
                        }
                    }
                }

                return comp.emplace<SimpleAssertionExpr>(Expression::bind(*expr, context, flags),
                                                         std::nullopt);
            }
        }
    }

    return &AssertionExpr::bind(syntax,
                                context.resetFlags(ASTFlags::AssertionInstanceArgCheck | flags));
}